

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

ssize_t __thiscall
wabt::intrusive_list<wabt::Expr>::splice
          (intrusive_list<wabt::Expr> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  iterator pos;
  iterator pos_00;
  iterator iVar2;
  undefined1 in_stack_0000000c [12];
  undefined1 local_50 [24];
  size_t local_38;
  
  pos_00.list_._4_4_ = in_register_00000034;
  pos_00.list_._0_4_ = __fdin;
  local_50._8_8_ = CONCAT44(in_register_0000000c,__fdout);
  local_50._16_8_ = __offout;
  local_38 = __len;
  while( true ) {
    iVar2._4_12_ = in_stack_0000000c;
    iVar2.list_._0_4_ = __flags;
    bVar1 = iterator::operator!=((iterator *)(local_50 + 0x10),iVar2);
    if (!bVar1) break;
    iVar2 = iterator::operator++((iterator *)(local_50 + 0x10),0);
    pos.node_ = (Expr *)iVar2.list_;
    pos.list_ = (intrusive_list<wabt::Expr> *)local_50._8_8_;
    extract((intrusive_list<wabt::Expr> *)local_50,pos);
    pos_00.node_ = (Expr *)__offin;
    insert(this,pos_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)local_50);
    if ((Expr *)local_50._0_8_ != (Expr *)0x0) {
      (*(*(_func_int ***)local_50._0_8_)[1])();
    }
    local_50._0_8_ = (Expr *)0x0;
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}